

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  uint32_t uVar1;
  pointer pUVar2;
  TransactionContext *pTVar3;
  SchnorrSignature *pSVar4;
  SchnorrPubkey *pSVar5;
  char cVar6;
  bool bVar7;
  undefined1 uVar8;
  uint uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  CfdException *pCVar12;
  long lVar13;
  pointer utxo;
  ByteData256 sighash;
  ByteData hash;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData target_utxo;
  undefined1 local_600 [56];
  OutPoint *local_5c8;
  TransactionContext *local_5c0;
  SchnorrSignature *local_5b8;
  SchnorrPubkey *local_5b0;
  ByteData *local_5a8;
  long local_5a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_598;
  OutPoint local_590;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_568;
  ByteData local_548;
  undefined1 local_52c [12];
  UtxoData local_520;
  
  local_5c8 = outpoint;
  local_598 = utxo_list;
  UtxoData::UtxoData(&local_520);
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (&local_568,
             (*(long *)&this->field_0x18 - *(long *)&this->field_0x10 >> 4) * -0x71c71c71c71c71c7);
  lVar13 = *(long *)&this->field_0x10;
  local_5a0 = *(long *)&this->field_0x18;
  local_5c0 = this;
  local_5b8 = signature;
  local_5b0 = pubkey;
  if (lVar13 != local_5a0) {
    local_5a8 = annex;
    do {
      cfd::core::AbstractTxIn::GetTxid();
      uVar9 = cfd::core::AbstractTxIn::GetVout();
      cfd::core::OutPoint::OutPoint(&local_590,(Txid *)local_600,uVar9);
      local_600._0_8_ = &PTR__Txid_002b0f00;
      if ((pointer)local_600._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_600._8_8_);
      }
      utxo = (local_598->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
             super__Vector_impl_data._M_start;
      pUVar2 = (local_598->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (utxo == pUVar2) {
LAB_001d3b9a:
        pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
        local_600._0_8_ = local_600 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_600,"Utxo is not found. VerifyInputSchnorrSignature fail.","");
        core::CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_600);
        __cxa_throw(pCVar12,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      bVar7 = false;
      do {
        while( true ) {
          cfd::core::AbstractTxIn::GetTxid();
          cVar6 = cfd::core::Txid::Equals((Txid *)local_600);
          if (cVar6 != '\0') break;
          local_600._0_8_ = &PTR__Txid_002b0f00;
          if ((pointer)local_600._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_600._8_8_);
          }
LAB_001d39c0:
          utxo = utxo + 1;
          if (utxo == pUVar2) {
            if (!bVar7) goto LAB_001d3b9a;
            goto LAB_001d39db;
          }
        }
        uVar10 = cfd::core::AbstractTxIn::GetVout();
        uVar1 = utxo->vout;
        local_600._0_8_ = &PTR__Txid_002b0f00;
        if ((pointer)local_600._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_600._8_8_);
        }
        if (uVar10 != uVar1) goto LAB_001d39c0;
        GetLockingScriptFromUtxoData((Script *)local_600,utxo);
        std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
        emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                  ((vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>> *)&local_568,
                   &utxo->amount,(Script *)local_600);
        cVar6 = cfd::core::OutPoint::operator==(local_5c8,&local_590);
        if (cVar6 != '\0') {
          UtxoData::operator=(&local_520,utxo);
          cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_600);
        }
        core::Script::~Script((Script *)local_600);
        utxo = utxo + 1;
        bVar7 = true;
      } while (utxo != pUVar2);
LAB_001d39db:
      local_590.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
      if (local_590.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_590.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar13 = lVar13 + 0x90;
      annex = local_5a8;
    } while (lVar13 != local_5a0);
  }
  cVar6 = cfd::core::Amount::operator==(&local_520.amount,0);
  pSVar5 = local_5b0;
  pSVar4 = local_5b8;
  pTVar3 = local_5c0;
  if (cVar6 != '\0') {
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_600._0_8_ = local_600 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_600,"OutPoint is not found into utxo_list.","");
    core::CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_600);
    __cxa_throw(pCVar12,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cVar6 = cfd::core::Script::IsTaprootScript();
  if (cVar6 == '\0') {
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_600._0_8_ = local_600 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_600,"Target OutPoint is not taproot.","");
    core::CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_600);
    __cxa_throw(pCVar12,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::Script::GetElementList();
  cfd::core::ScriptElement::GetBinaryData();
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             local_600);
  cfd::core::SchnorrPubkey::GetData();
  cVar6 = cfd::core::ByteData::Equals((ByteData *)&local_590);
  if ((pointer)local_600._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_600._0_8_);
  }
  if (cVar6 == '\0') {
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_600._0_8_ = local_600 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_600,"Unmatch locking script.","");
    core::CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_600);
    __cxa_throw(pCVar12,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar11 = (**(code **)(*(long *)pTVar3 + 0x78))(pTVar3,local_5c8);
  cfd::core::SchnorrSignature::GetSigHashType();
  if (annex == (ByteData *)0x0) {
    cfd::core::ByteData::ByteData(&local_548);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_548.data_,&annex->data_);
  }
  cfd::core::Transaction::GetSchnorrSignatureHash
            (local_600,pTVar3,uVar11,local_52c,&local_568,0,&local_548);
  if (local_548.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar8 = cfd::core::SchnorrPubkey::Verify((SchnorrSignature *)pSVar5,(ByteData256 *)pSVar4);
  if ((pointer)local_600._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_600._0_8_);
  }
  if (local_590.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_590.txid_._vptr_Txid);
  }
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&local_568);
  UtxoData::~UtxoData(&local_520);
  return (bool)uVar8;
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}